

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EstimatorUtilStats.h
# Opt level: O1

EstimatorStats *
GetErrorStatistics(EstimatorStats *__return_storage_ptr__,
                  vector<Estimates,_std::allocator<Estimates>_> *algo_estimates,Count true_count)

{
  double dVar1;
  double dVar2;
  double dVar3;
  pointer pEVar4;
  long lVar5;
  int iVar6;
  pointer pEVar7;
  pointer pdVar8;
  pointer pEVar9;
  double *pdVar10;
  ulong uVar11;
  double *pdVar12;
  double *pdVar13;
  pointer pEVar14;
  pointer pEVar15;
  pointer pEVar16;
  pointer pEVar17;
  uint uVar18;
  ulong uVar19;
  bool bVar20;
  bool bVar21;
  double dVar22;
  double dVar23;
  vector<double,_std::allocator<double>_> algo_error_percentage_list;
  vector<double,_std::allocator<double>_> diff;
  allocator_type local_71;
  double local_70;
  vector<double,_std::allocator<double>_> local_68;
  double local_50;
  double local_48;
  vector<double,_std::allocator<double>_> local_40;
  
  uVar19 = (long)(algo_estimates->super__Vector_base<Estimates,_std::allocator<Estimates>_>)._M_impl
                 .super__Vector_impl_data._M_finish -
           (long)(algo_estimates->super__Vector_base<Estimates,_std::allocator<Estimates>_>)._M_impl
                 .super__Vector_impl_data._M_start;
  uVar18 = (uint)(uVar19 >> 5);
  std::vector<double,_std::allocator<double>_>::vector
            (&local_68,(long)(int)uVar18,(allocator_type *)&local_40);
  if (0 < (int)uVar18) {
    pEVar7 = (algo_estimates->super__Vector_base<Estimates,_std::allocator<Estimates>_>)._M_impl.
             super__Vector_impl_data._M_start;
    uVar11 = 0;
    do {
      local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start[uVar11] = (ABS(pEVar7->estimate - (double)true_count) * 100.0) / (double)true_count;
      uVar11 = uVar11 + 1;
      pEVar7 = pEVar7 + 1;
    } while ((uVar18 & 0x7fffffff) != uVar11);
  }
  iVar6 = (int)(((uint)(uVar19 >> 0x24) & 1) + uVar18) >> 1;
  if ((local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
       _M_start !=
       local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
       _M_finish) &&
     (local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start + iVar6 !=
      local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish)) {
    uVar19 = (long)local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start >> 3;
    lVar5 = 0x3f;
    if (uVar19 != 0) {
      for (; uVar19 >> lVar5 == 0; lVar5 = lVar5 + -1) {
      }
    }
    std::
    __introselect<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              ();
  }
  pdVar12 = local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start + 1;
  pdVar10 = local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start;
  pdVar13 = local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (pdVar12 !=
      local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish &&
      local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    do {
      pdVar10 = pdVar12;
      if (*pdVar12 < *pdVar13 || *pdVar12 == *pdVar13) {
        pdVar10 = pdVar13;
      }
      pdVar12 = pdVar12 + 1;
      pdVar13 = pdVar10;
    } while (pdVar12 !=
             local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  local_70 = 0.0;
  for (pdVar12 = local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
      pdVar12 !=
      local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish; pdVar12 = pdVar12 + 1) {
    local_70 = local_70 + *pdVar12;
  }
  local_50 = local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[iVar6];
  local_48 = *pdVar10;
  std::vector<double,_std::allocator<double>_>::vector(&local_40,(long)(int)uVar18,&local_71);
  dVar23 = local_70 / (double)(int)uVar18;
  pdVar10 = local_40.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start;
  for (pdVar12 = local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
      pdVar12 !=
      local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish; pdVar12 = pdVar12 + 1) {
    *pdVar10 = *pdVar12 - dVar23;
    pdVar10 = pdVar10 + 1;
  }
  dVar22 = 0.0;
  for (pdVar8 = local_40.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start;
      pdVar8 != local_40.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish; pdVar8 = pdVar8 + 1) {
    dVar22 = dVar22 + *pdVar8 * *pdVar8;
  }
  dVar22 = dVar22 / (double)(int)uVar18;
  if (dVar22 < 0.0) {
    local_70 = dVar23;
    dVar22 = sqrt(dVar22);
    dVar23 = local_70;
  }
  else {
    dVar22 = SQRT(dVar22);
  }
  pEVar7 = (algo_estimates->super__Vector_base<Estimates,_std::allocator<Estimates>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pEVar4 = (algo_estimates->super__Vector_base<Estimates,_std::allocator<Estimates>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  bVar20 = pEVar7 != pEVar4;
  pEVar9 = pEVar7 + 1;
  bVar21 = pEVar9 != pEVar4;
  pEVar14 = pEVar7;
  pEVar15 = pEVar9;
  pEVar16 = pEVar7;
  if (bVar21 && bVar20) {
    do {
      pEVar14 = pEVar15;
      if (pEVar15->fraction_of_vertices_seen < pEVar16->fraction_of_vertices_seen ||
          pEVar15->fraction_of_vertices_seen == pEVar16->fraction_of_vertices_seen) {
        pEVar14 = pEVar16;
      }
      pEVar15 = pEVar15 + 1;
      pEVar16 = pEVar14;
    } while (pEVar15 != pEVar4);
  }
  pEVar15 = pEVar9;
  pEVar16 = pEVar7;
  pEVar17 = pEVar7;
  if (bVar21 && bVar20) {
    do {
      pEVar16 = pEVar15;
      if (pEVar15->fraction_of_edges_seen < pEVar17->fraction_of_edges_seen ||
          pEVar15->fraction_of_edges_seen == pEVar17->fraction_of_edges_seen) {
        pEVar16 = pEVar17;
      }
      pEVar15 = pEVar15 + 1;
      pEVar17 = pEVar16;
    } while (pEVar15 != pEVar4);
  }
  dVar1 = pEVar14->fraction_of_vertices_seen;
  dVar2 = pEVar16->fraction_of_edges_seen;
  if (bVar21 && bVar20) {
    do {
      pEVar14 = pEVar9;
      if (pEVar9->fraction_of_edges_seen < pEVar7->fraction_of_edges_seen ||
          pEVar9->fraction_of_edges_seen == pEVar7->fraction_of_edges_seen) {
        pEVar14 = pEVar7;
      }
      pEVar7 = pEVar14;
      pEVar9 = pEVar9 + 1;
    } while (pEVar9 != pEVar4);
  }
  dVar3 = pEVar7->query_complexity;
  __return_storage_ptr__->no_of_repeats = uVar18;
  __return_storage_ptr__->mean_error_percentage = dVar23;
  __return_storage_ptr__->median_error_percentage = local_50;
  __return_storage_ptr__->stddev_error_percentage = dVar22;
  __return_storage_ptr__->max_error_percentage = local_48;
  __return_storage_ptr__->vertices_seen_max_percentage = dVar1;
  __return_storage_ptr__->edges_seen_max_percentage = dVar2;
  __return_storage_ptr__->query_complexity_max_percentage = dVar3;
  if (local_40.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (double *)0x0) {
    operator_delete(local_40.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_40.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_40.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (double *)0x0) {
    operator_delete(local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

EstimatorStats GetErrorStatistics(std::vector<Estimates> algo_estimates, Count true_count) {

    int no_of_repeats = (int) algo_estimates.size();

    // Populate the error percentage for each run
    std::vector<double> algo_error_percentage_list(no_of_repeats);
    // TODO consider using lambda function
    for (int i = 0; i < no_of_repeats; i++)
        algo_error_percentage_list[i] =
                std::abs(algo_estimates[i].estimate - true_count) * 100 / true_count;

    int middle_index = no_of_repeats / 2;
    std::nth_element(algo_error_percentage_list.begin(), algo_error_percentage_list.begin() + middle_index,
                     algo_error_percentage_list.end());
    double median_error_percentage = algo_error_percentage_list[middle_index];

    double max_error_percentage = *std::max_element(algo_error_percentage_list.begin(),
                                                    algo_error_percentage_list.end());

    double sum = std::accumulate(algo_error_percentage_list.begin(), algo_error_percentage_list.end(), 0.0);
    double mean_error_percentage = sum / no_of_repeats;

    std::vector<double> diff(no_of_repeats);
    std::transform(algo_error_percentage_list.begin(), algo_error_percentage_list.end(), diff.begin(),
                   [mean_error_percentage](double x) { return x - mean_error_percentage; });
    double sq_sum = std::inner_product(diff.begin(), diff.end(), diff.begin(), 0.0);
    double stdev_error_percentage = std::sqrt(sq_sum / no_of_repeats);


    // Maximum edges and vertices seen over all the runs
    double vertices_seen_percentage = (*std::max_element(algo_estimates.begin(),
                                                         algo_estimates.end(),
                                                         ComparatorByVerticesSeen)).fraction_of_vertices_seen;
    double edges_seen_percentage = (*std::max_element(algo_estimates.begin(),
                                                      algo_estimates.end(),
                                                      ComparatorByEdgesSeen)).fraction_of_edges_seen;

    double query_complexity_percentage = (*std::max_element(algo_estimates.begin(),
                                                      algo_estimates.end(),
                                                      ComparatorByEdgesSeen)).query_complexity;

    EstimatorStats est_stats = {no_of_repeats, mean_error_percentage, median_error_percentage,
                                stdev_error_percentage, max_error_percentage,
                                vertices_seen_percentage, edges_seen_percentage, query_complexity_percentage};
    return est_stats;
}